

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

bool transcode_utf8(string *utf8_val,string *result,encoding_e encoding,char unknown)

{
  int iVar1;
  char *pcVar2;
  QUtil *this;
  unsigned_long uval;
  unsigned_long uval_00;
  uchar local_a1;
  undefined1 local_a0 [7];
  uchar ch_1;
  string local_80;
  char local_59;
  QUtil *pQStack_58;
  char ch;
  unsigned_long codepoint;
  ulong uStack_48;
  bool error;
  size_t pos;
  allocator<char> local_29;
  ulong local_28;
  size_t len;
  bool okay;
  char unknown_local;
  string *psStack_18;
  encoding_e encoding_local;
  string *result_local;
  string *utf8_val_local;
  
  len._2_1_ = 1;
  len._3_1_ = unknown;
  len._4_4_ = encoding;
  psStack_18 = result;
  result_local = utf8_val;
  std::__cxx11::string::clear();
  local_28 = std::__cxx11::string::length();
  if (len._4_4_ == e_utf16) {
    std::__cxx11::string::operator+=((string *)psStack_18,anon_var_dwarf_676e47);
  }
  else if (((len._4_4_ == e_pdfdoc) && (3 < local_28)) &&
          (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)result_local), *pcVar2 == -0x3d)
          ) {
    if ((transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)::
         fe_ff_abi_cxx11_ == '\0') &&
       (iVar1 = __cxa_guard_acquire(&transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                                     ::fe_ff_abi_cxx11_), iVar1 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                  ::fe_ff_abi_cxx11_,anon_var_dwarf_676e53,&local_29);
      std::allocator<char>::~allocator(&local_29);
      __cxa_atexit(std::__cxx11::string::~string,
                   &transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                    ::fe_ff_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                           ::fe_ff_abi_cxx11_);
    }
    if ((transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)::
         ff_fe_abi_cxx11_ == '\0') &&
       (iVar1 = __cxa_guard_acquire(&transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                                     ::ff_fe_abi_cxx11_), iVar1 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                  ::ff_fe_abi_cxx11_,anon_var_dwarf_67709d,(allocator<char> *)((long)&pos + 3));
      std::allocator<char>::~allocator((allocator<char> *)((long)&pos + 3));
      __cxa_atexit(std::__cxx11::string::~string,
                   &transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                    ::ff_fe_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                           ::ff_fe_abi_cxx11_);
    }
    if ((transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)::
         ef_bb_bf_abi_cxx11_ == '\0') &&
       (iVar1 = __cxa_guard_acquire(&transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                                     ::ef_bb_bf_abi_cxx11_), iVar1 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                  ::ef_bb_bf_abi_cxx11_,anon_var_dwarf_6770a9,(allocator<char> *)((long)&pos + 2));
      std::allocator<char>::~allocator((allocator<char> *)((long)&pos + 2));
      __cxa_atexit(std::__cxx11::string::~string,
                   &transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                    ::ef_bb_bf_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&transcode_utf8(std::__cxx11::string_const&,std::__cxx11::string&,encoding_e,char)
                           ::ef_bb_bf_abi_cxx11_);
    }
    iVar1 = std::__cxx11::string::compare((ulong)result_local,1,(string *)0x3);
    if (((iVar1 == 0) ||
        (iVar1 = std::__cxx11::string::compare((ulong)result_local,1,(string *)0x3), iVar1 == 0)) ||
       (iVar1 = std::__cxx11::string::compare((ulong)result_local,1,(string *)0x5), iVar1 == 0)) {
      std::__cxx11::string::operator+=((string *)psStack_18,len._3_1_);
      len._2_1_ = 0;
    }
  }
  uStack_48 = 0;
  while (uStack_48 < local_28) {
    codepoint._7_1_ = 0;
    pQStack_58 = (QUtil *)QUtil::get_next_utf8_codepoint
                                    (result_local,&stack0xffffffffffffffb8,
                                     (bool *)((long)&codepoint + 7));
    if ((codepoint._7_1_ & 1) == 0) {
      if (pQStack_58 < (QUtil *)0x80) {
        local_59 = (char)pQStack_58;
        if (len._4_4_ == e_utf16) {
          this = (QUtil *)QIntC::to_ulong<char>(&local_59);
          QUtil::toUTF16_abi_cxx11_(&local_80,this,uval_00);
          std::__cxx11::string::operator+=((string *)psStack_18,(string *)&local_80);
          std::__cxx11::string::~string((string *)&local_80);
        }
        else if ((len._4_4_ == e_pdfdoc) &&
                ((('\x17' < local_59 && (local_59 < ' ')) || (local_59 == '\x7f')))) {
          len._2_1_ = 0;
          std::__cxx11::string::append((ulong)psStack_18,'\x01');
        }
        else {
          std::__cxx11::string::append((ulong)psStack_18,'\x01');
        }
      }
      else if (len._4_4_ == e_utf16) {
        QUtil::toUTF16_abi_cxx11_((string *)local_a0,pQStack_58,uval);
        std::__cxx11::string::operator+=((string *)psStack_18,(string *)local_a0);
        std::__cxx11::string::~string((string *)local_a0);
      }
      else if ((pQStack_58 == (QUtil *)0xad) && (len._4_4_ == e_pdfdoc)) {
        len._2_1_ = 0;
        std::__cxx11::string::append((ulong)psStack_18,'\x01');
      }
      else if (((pQStack_58 < (QUtil *)0xa1) || ((QUtil *)0xff < pQStack_58)) ||
              ((len._4_4_ != e_winansi && (len._4_4_ != e_pdfdoc)))) {
        local_a1 = '\0';
        if (len._4_4_ == e_winansi) {
          local_a1 = encode_winansi((unsigned_long)pQStack_58);
        }
        else if (len._4_4_ == e_macroman) {
          local_a1 = encode_macroman((unsigned_long)pQStack_58);
        }
        else if (len._4_4_ == e_pdfdoc) {
          local_a1 = encode_pdfdoc((unsigned_long)pQStack_58);
        }
        if (local_a1 == '\0') {
          len._2_1_ = 0;
        }
        std::__cxx11::string::append((ulong)psStack_18,'\x01');
      }
      else {
        std::__cxx11::string::append((ulong)psStack_18,'\x01');
      }
    }
    else {
      len._2_1_ = 0;
      if (len._4_4_ == e_utf16) {
        std::__cxx11::string::operator+=((string *)psStack_18,anon_var_dwarf_676b57);
      }
      else {
        std::__cxx11::string::append((ulong)psStack_18,'\x01');
      }
    }
  }
  return (bool)(len._2_1_ & 1);
}

Assistant:

static bool
transcode_utf8(std::string const& utf8_val, std::string& result, encoding_e encoding, char unknown)
{
    bool okay = true;
    result.clear();
    size_t len = utf8_val.length();
    switch (encoding) {
    case e_utf16:
        result += "\xfe\xff";
        break;
    case e_pdfdoc:
        // We need to avoid having the result start with something that will be interpreted as
        // UTF-16 or UTF-8, meaning we can't end up with a string that starts with "fe ff",
        // (UTF-16-BE) "ff fe" (UTF-16-LE, not officially part of the PDF spec, but recognized by
        // most readers including qpdf), or "ef bb bf" (UTF-8). It's more efficient to check the
        // input string to see if it will map to one of those sequences than to check the output
        // string since all cases start with the same starting character.
        if ((len >= 4) && (utf8_val[0] == '\xc3')) {
            static std::string fe_ff("\xbe\xc3\xbf");
            static std::string ff_fe("\xbf\xc3\xbe");
            static std::string ef_bb_bf("\xaf\xc2\xbb\xc2\xbf");
            // C++-20 has starts_with, but when this was written, qpdf had a minimum supported
            // version of C++-17.
            if ((utf8_val.compare(1, 3, fe_ff) == 0) || (utf8_val.compare(1, 3, ff_fe) == 0) ||
                (utf8_val.compare(1, 5, ef_bb_bf) == 0)) {
                result += unknown;
                okay = false;
            }
        }
        break;
    default:
        break;
    }
    size_t pos = 0;
    while (pos < len) {
        bool error = false;
        unsigned long codepoint = QUtil::get_next_utf8_codepoint(utf8_val, pos, error);
        if (error) {
            okay = false;
            if (encoding == e_utf16) {
                result += "\xff\xfd";
            } else {
                result.append(1, unknown);
            }
        } else if (codepoint < 128) {
            char ch = static_cast<char>(codepoint);
            if (encoding == e_utf16) {
                result += QUtil::toUTF16(QIntC::to_ulong(ch));
            } else if ((encoding == e_pdfdoc) && (((ch >= 0x18) && (ch <= 0x1f)) || (ch == 127))) {
                // PDFDocEncoding maps some low characters to Unicode, so if we encounter those
                // invalid UTF-8 code points, map them to unknown so reversing the mapping doesn't
                // change them into other characters.
                okay = false;
                result.append(1, unknown);
            } else {
                result.append(1, ch);
            }
        } else if (encoding == e_utf16) {
            result += QUtil::toUTF16(codepoint);
        } else if ((codepoint == 0xad) && (encoding == e_pdfdoc)) {
            // PDFDocEncoding omits 0x00ad (soft hyphen).
            okay = false;
            result.append(1, unknown);
        } else if (
            (codepoint > 160) && (codepoint < 256) &&
            ((encoding == e_winansi) || (encoding == e_pdfdoc))) {
            result.append(1, static_cast<char>(codepoint & 0xff));
        } else {
            unsigned char ch = '\0';
            if (encoding == e_winansi) {
                ch = encode_winansi(codepoint);
            } else if (encoding == e_macroman) {
                ch = encode_macroman(codepoint);
            } else if (encoding == e_pdfdoc) {
                ch = encode_pdfdoc(codepoint);
            }
            if (ch == '\0') {
                okay = false;
                ch = static_cast<unsigned char>(unknown);
            }
            result.append(1, static_cast<char>(ch));
        }
    }
    return okay;
}